

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_sse2.h
# Opt level: O0

void store_8bit_8x8(__m128i *s,uint8_t *d,ptrdiff_t stride)

{
  ptrdiff_t stride_local;
  uint8_t *d_local;
  __m128i *s_local;
  
  *(longlong *)d = (*s)[0];
  *(longlong *)(d + stride) = s[1][0];
  *(longlong *)(d + stride * 2) = s[2][0];
  *(longlong *)(d + stride * 3) = s[3][0];
  *(longlong *)(d + stride * 4) = s[4][0];
  *(longlong *)(d + stride * 5) = s[5][0];
  *(longlong *)(d + stride * 6) = s[6][0];
  *(longlong *)(d + stride * 7) = s[7][0];
  return;
}

Assistant:

static inline void store_8bit_8x8(const __m128i *const s, uint8_t *const d,
                                  const ptrdiff_t stride) {
  _mm_storel_epi64((__m128i *)(d + 0 * stride), s[0]);
  _mm_storel_epi64((__m128i *)(d + 1 * stride), s[1]);
  _mm_storel_epi64((__m128i *)(d + 2 * stride), s[2]);
  _mm_storel_epi64((__m128i *)(d + 3 * stride), s[3]);
  _mm_storel_epi64((__m128i *)(d + 4 * stride), s[4]);
  _mm_storel_epi64((__m128i *)(d + 5 * stride), s[5]);
  _mm_storel_epi64((__m128i *)(d + 6 * stride), s[6]);
  _mm_storel_epi64((__m128i *)(d + 7 * stride), s[7]);
}